

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O2

void __thiscall
jaegertracing::Span::SetBaggageItem(Span *this,string_view restrictedKey,string_view value)

{
  element_type *peVar1;
  RestrictionManager *pRVar2;
  _Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
  _Var3;
  uint uVar4;
  int extraout_var;
  iterator iVar5;
  mapped_type *pmVar6;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffe60;
  string local_198;
  string local_178;
  undefined1 local_158 [32];
  string_view value_local;
  string_view restrictedKey_local;
  StrMap baggage;
  SpanContext local_e0;
  
  value_local.length_ = value.length_;
  value_local.data_ = value.data_;
  restrictedKey_local.length_ = restrictedKey.length_;
  restrictedKey_local.data_ = restrictedKey.data_;
  std::mutex::lock(&this->_mutex);
  peVar1 = (this->_tracer).
           super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&baggage._M_h,&(this->_context)._baggage._M_h);
  opentracing::v3::string_view::operator_cast_to_string((string *)local_158,&restrictedKey_local);
  opentracing::v3::string_view::operator_cast_to_string(&local_178,&value_local);
  pRVar2 = (peVar1->_baggageSetter)._restrictionManager;
  serviceNameNoLock_abi_cxx11_(&local_198,this);
  uVar4 = (*pRVar2->_vptr_RestrictionManager[2])(pRVar2,&local_198,local_158);
  std::__cxx11::string::~string((string *)&local_198);
  if ((uVar4 & 1) == 0) {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    jaegertracing::baggage::BaggageSetter::
    logFields<jaegertracing::Span::SetBaggageItem(opentracing::v3::string_view,opentracing::v3::string_view)::__0>
              ((BaggageSetter *)this,(Span *)local_158,&local_178,&local_198,(string *)0x0,false,
               SUB81(this,0),in_stack_fffffffffffffe60);
    std::__cxx11::string::~string((string *)&local_198);
    _Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
         (((peVar1->_baggageSetter)._metrics)->_baggageUpdateFailure)._M_t.
         super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
         ._M_t.
         super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
         .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
    (**(code **)(*(long *)_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                          _M_head_impl + 0x10))
              (_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,1)
    ;
  }
  else {
    if (extraout_var < (int)local_178._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_198,(ulong)&local_178);
      std::__cxx11::string::operator=((string *)&local_178,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      _Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
           (((peVar1->_baggageSetter)._metrics)->_baggageTruncate)._M_t.
           super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
           .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
      (**(code **)(*(long *)_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                            _M_head_impl + 0x10))
                (_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,
                 1);
    }
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&baggage._M_h,(key_type *)local_158);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      local_198._M_string_length = 0;
      local_198.field_2._M_local_buf[0] = '\0';
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&baggage,(key_type *)local_158);
    }
    else {
      pmVar6 = (mapped_type *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x28);
      std::__cxx11::string::string((string *)&local_198,(string *)pmVar6);
    }
    std::__cxx11::string::_M_assign((string *)pmVar6);
    jaegertracing::baggage::BaggageSetter::
    logFields<jaegertracing::Span::SetBaggageItem(opentracing::v3::string_view,opentracing::v3::string_view)::__0>
              ((BaggageSetter *)this,(Span *)local_158,&local_178,&local_198,
               (string *)(ulong)(extraout_var < (int)local_178._M_string_length),true,SUB81(this,0),
               in_stack_fffffffffffffe60);
    _Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
         (((peVar1->_baggageSetter)._metrics)->_baggageUpdateSuccess)._M_t.
         super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
         ._M_t.
         super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
         .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
    (**(code **)(*(long *)_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                          _M_head_impl + 0x10))
              (_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,1)
    ;
    std::__cxx11::string::~string((string *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)local_158);
  SpanContext::withBaggage(&local_e0,&this->_context,&baggage);
  SpanContext::swap(&this->_context,&local_e0);
  SpanContext::~SpanContext(&local_e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&baggage._M_h);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

void Span::SetBaggageItem(opentracing::string_view restrictedKey,
                          opentracing::string_view value) noexcept
{
    std::lock_guard<std::mutex> lock(_mutex);
    const auto& baggageSetter = _tracer->baggageSetter();
    auto baggage = _context.baggage();
    baggageSetter.setBaggage(*this,
                             baggage,
                             restrictedKey,
                             value,
                             [this](std::vector<Tag>::const_iterator first,
                                    std::vector<Tag>::const_iterator last) {
                                 logFieldsNoLocking(SystemClock::now(), first, last);
                             });
    _context = _context.withBaggage(baggage);
}